

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::abc::abc(abc *this,char *name)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  exc *this_00;
  unpolarized local_78;
  ptr local_60;
  valarray<float> local_58;
  float local_44;
  undefined1 local_40 [8];
  value_type ior;
  int i;
  bool found;
  char *name_local;
  abc *this_local;
  
  brdf_rgb::brdf_rgb(&this->super_brdf_rgb);
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00277500;
  fresnel::ptr::ptr(&this->m_fresnel);
  this->m_data = (data *)0x0;
  bVar1 = false;
  ior._M_data._4_4_ = 0;
  do {
    if (99 < ior._M_data._4_4_) {
LAB_00168a0e:
      if (!bVar1) {
        this_00 = (exc *)__cxa_allocate_exception(0x28);
        exc::exc(this_00,"djb_error: No ABC parameters for %s\n",name);
        __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
      }
      return;
    }
    iVar2 = strcmp(*(char **)(s_data + (long)ior._M_data._4_4_ * 0x50),name);
    if (iVar2 == 0) {
      this->m_data = (data *)(s_data + (long)ior._M_data._4_4_ * 0x50);
      local_44 = (float)this->m_data->ior;
      (*(this->super_brdf_rgb).super_brdf._vptr_brdf[2])(&local_58);
      __n = std::valarray<float>::size(&local_58);
      std::valarray<float>::valarray((valarray<float> *)local_40,&local_44,__n);
      std::valarray<float>::~valarray(&local_58);
      fresnel::unpolarized::unpolarized(&local_78,(value_type *)local_40);
      fresnel::ptr::ptr(&local_60,&local_78.super_impl);
      fresnel::ptr::operator=(&this->m_fresnel,&local_60);
      fresnel::ptr::~ptr(&local_60);
      fresnel::unpolarized::~unpolarized(&local_78);
      bVar1 = true;
      std::valarray<float>::~valarray((valarray<float> *)local_40);
      goto LAB_00168a0e;
    }
    ior._M_data._4_4_ = ior._M_data._4_4_ + 1;
  } while( true );
}

Assistant:

abc::abc(const char *name): m_fresnel(), m_data(NULL)
{
	bool found = false;

	for (int i = 0; i < (int)(sizeof(abc::s_data) / sizeof(abc::data)); ++i) {
		if (!strcmp(s_data[i].name, name)) {
			m_data = &s_data[i];
			brdf::value_type ior(m_data->ior, zero_value().size());
			m_fresnel = fresnel::ptr(fresnel::unpolarized(ior));
			found = true;
			break;
		}
	}
	if (!found) throw exc("djb_error: No ABC parameters for %s\n", name);
}